

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cputlb.c
# Opt level: O3

tb_page_addr_t
get_page_addr_code_hostp_aarch64(CPUArchState_conflict1 *env,target_ulong addr,void **hostp)

{
  uc_struct_conflict2 *puVar1;
  TargetPageBits_conflict *pTVar2;
  ulong uVar3;
  _Bool _Var4;
  long lVar5;
  tb_page_addr_t tVar6;
  ulong uVar7;
  ulong index;
  long lVar8;
  long lVar9;
  ulong page;
  uc_struct_conflict2 *uc;
  ulong uVar10;
  uint mmu_idx;
  void *ptr;
  CPUARMState_conflict *__mptr;
  
  puVar1 = env->uc;
  mmu_idx = *(byte *)((long)&env->hflags + 3) & 0xf;
  uVar10 = (ulong)(mmu_idx << 4);
  lVar8 = *(long *)((long)env + (uVar10 - 200));
  pTVar2 = puVar1->init_target_page;
  index = addr >> ((byte)pTVar2->bits & 0x3f) & *(ulong *)((long)env + (uVar10 - 0xd0)) >> 6;
  lVar5 = index * 0x40;
  lVar9 = lVar8 + lVar5;
  uVar7 = *(ulong *)(lVar8 + 0x10 + lVar5);
  uVar3 = pTVar2->mask;
  page = uVar3 & addr;
  if (((uVar3 | 0x200) & uVar7) != page) {
    _Var4 = victim_tlb_hit(env,(ulong)mmu_idx,index,0x10,page);
    if (_Var4) {
      uVar7 = *(ulong *)(lVar9 + 0x10);
    }
    else {
      tlb_fill((CPUState *)(env[-4].vfp.zregs[0x17].d + 0x14),addr,0,MMU_INST_FETCH,mmu_idx,0);
      lVar9 = *(long *)((long)env + (uVar10 - 200));
      lVar8 = (addr >> ((byte)env->uc->init_target_page->bits & 0x3f) &
              *(ulong *)((long)env + (uVar10 - 0xd0)) >> 6) * 0x40;
      uVar7 = *(ulong *)(lVar9 + 0x10 + lVar8);
      if (((uint)uVar7 >> 9 & 1) != 0) {
        return 0xffffffffffffffff;
      }
      lVar9 = lVar9 + lVar8;
    }
    uVar3 = puVar1->init_target_page->mask;
    if (((uVar3 | 0x200) & uVar7) != (uVar3 & addr)) {
      __assert_fail("tlb_hit(uc, entry->addr_code, addr)",
                    "/workspace/llm4binary/github/license_c_cmakelists/AFLplusplus[P]unicornafl/unicorn/qemu/accel/tcg/cputlb.c"
                    ,0x463,
                    "tb_page_addr_t get_page_addr_code_hostp_aarch64(CPUArchState *, target_ulong, void **)"
                   );
    }
  }
  if ((char)uVar7 < '\0') {
    tVar6 = 0xffffffffffffffff;
    if (hostp != (void **)0x0) {
      *hostp = (void *)0x0;
    }
  }
  else {
    ptr = (void *)(addr + *(long *)(lVar9 + 0x20));
    if (hostp != (void **)0x0) {
      *hostp = ptr;
    }
    tVar6 = qemu_ram_addr_from_host_aarch64(env->uc,ptr);
    if (tVar6 == 0xffffffffffffffff) {
      abort();
    }
  }
  return tVar6;
}

Assistant:

tb_page_addr_t get_page_addr_code_hostp(CPUArchState *env, target_ulong addr,
                                        void **hostp)
{
    struct uc_struct *uc = env->uc;
    uintptr_t mmu_idx = cpu_mmu_index(env, true);
    uintptr_t index = tlb_index(env, mmu_idx, addr);
    CPUTLBEntry *entry = tlb_entry(env, mmu_idx, addr);
    void *p;

    if (unlikely(!tlb_hit(uc, entry->addr_code, addr))) {
        if (!VICTIM_TLB_HIT(addr_code, addr)) {
            tlb_fill(env_cpu(env), addr, 0, MMU_INST_FETCH, mmu_idx, 0);
            index = tlb_index(env, mmu_idx, addr);
            entry = tlb_entry(env, mmu_idx, addr);

            if (unlikely(entry->addr_code & TLB_INVALID_MASK)) {
                /*
                 * The MMU protection covers a smaller range than a target
                 * page, so we must redo the MMU check for every insn.
                 */
                return -1;
            }
        }
        assert(tlb_hit(uc, entry->addr_code, addr));
    }

    if (unlikely(entry->addr_code & TLB_MMIO)) {
        /* The region is not backed by RAM.  */
        if (hostp) {
            *hostp = NULL;
        }
        return -1;
    }

    p = (void *)((uintptr_t)addr + entry->addend);
    if (hostp) {
        *hostp = p;
    }
    return qemu_ram_addr_from_host_nofail(env->uc, p);
}